

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrRenderer.cpp
# Opt level: O0

void rr::anon_unknown_19::drawWithGeometryShader<(rr::PrimitiveType)6>
               (RenderState *state,RenderTarget *renderTarget,Program *program,
               vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *input,DrawContext *drawContext
               )

{
  int iVar1;
  GeometryShader *pGVar2;
  ulong uVar3;
  size_t sVar4;
  bool bVar5;
  GeometryShaderOutputType GVar6;
  vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_> *this;
  size_type sVar7;
  size_t sVar8;
  reference pvVar9;
  reference in;
  reference ppVVar10;
  ulong local_108;
  size_t primitiveEnd;
  size_t primitiveBegin;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> emitted;
  int invocationNdx;
  size_t primitiveNdx;
  int verticesIn;
  int numInvocations;
  vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> primitives;
  undefined1 local_98 [8];
  GeometryEmitter emitter;
  VertexPacketAllocator vpalloc;
  DrawContext *drawContext_local;
  vector<rr::pa::Point,_std::allocator<rr::pa::Point>_> *input_local;
  Program *program_local;
  RenderTarget *renderTarget_local;
  RenderState *state_local;
  
  this = GeometryShader::getOutputs(program->geometryShader);
  sVar7 = std::vector<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>::size(this);
  VertexPacketAllocator::VertexPacketAllocator
            ((VertexPacketAllocator *)&emitter.m_maxVertices,sVar7);
  sVar8 = GeometryShader::getNumVerticesOut(program->geometryShader);
  GeometryEmitter::GeometryEmitter
            ((GeometryEmitter *)local_98,(VertexPacketAllocator *)&emitter.m_maxVertices,sVar8);
  sVar7 = std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::size(input);
  std::allocator<rr::PrimitivePacket>::allocator
            ((allocator<rr::PrimitivePacket> *)((long)&verticesIn + 3));
  std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::vector
            ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)&numInvocations,
             sVar7,(allocator<rr::PrimitivePacket> *)((long)&verticesIn + 3));
  std::allocator<rr::PrimitivePacket>::~allocator
            ((allocator<rr::PrimitivePacket> *)((long)&verticesIn + 3));
  sVar8 = GeometryShader::getNumInvocations(program->geometryShader);
  for (_invocationNdx = 0;
      sVar7 = std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::size(input),
      _invocationNdx < sVar7; _invocationNdx = _invocationNdx + 1) {
    iVar1 = drawContext->primitiveID;
    drawContext->primitiveID = iVar1 + 1;
    pvVar9 = std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::operator[]
                       ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)
                        &numInvocations,_invocationNdx);
    pvVar9->primitiveIDIn = iVar1;
    pvVar9 = std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::operator[]
                       ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)
                        &numInvocations,_invocationNdx);
    in = std::vector<rr::pa::Point,_std::allocator<rr::pa::Point>_>::operator[]
                   (input,_invocationNdx);
    copyVertexPacketPointers(pvVar9->vertices,in);
  }
  bVar5 = std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::empty
                    ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)
                     &numInvocations);
  if (bVar5) {
    emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    for (emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl
         .super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        (int)emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
             _M_impl.super__Vector_impl_data._M_end_of_storage < (int)sVar8;
        emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ =
             (int)emitted.
                  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1) {
      pGVar2 = program->geometryShader;
      pvVar9 = std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::operator[]
                         ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)
                          &numInvocations,0);
      sVar7 = std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::size
                        ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)
                         &numInvocations);
      (*(code *)**(undefined8 **)pGVar2)
                (pGVar2,local_98,1,pvVar9,sVar7 & 0xffffffff,
                 (int)emitted.
                      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::vector
                ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&primitiveBegin)
      ;
      GeometryEmitter::moveEmittedTo
                ((GeometryEmitter *)local_98,
                 (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&primitiveBegin)
      ;
      primitiveEnd = 0;
      while (sVar7 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::size
                               ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                                &primitiveBegin), primitiveEnd < sVar7) {
        ppVVar10 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::operator[]
                             ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                              &primitiveBegin,primitiveEnd);
        sVar4 = primitiveEnd;
        if (*ppVVar10 == (value_type)0x0) {
          primitiveEnd = primitiveEnd + 1;
        }
        else {
          do {
            uVar3 = sVar4;
            local_108 = uVar3 + 1;
            sVar7 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::size
                              ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)
                               &primitiveBegin);
            bVar5 = false;
            if (local_108 < sVar7) {
              ppVVar10 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                         operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                                     *)&primitiveBegin,local_108);
              bVar5 = *ppVVar10 != (value_type)0x0;
            }
            sVar4 = local_108;
          } while (bVar5);
          GVar6 = GeometryShader::getOutputType(program->geometryShader);
          if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_POINTS) {
            ppVVar10 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&primitiveBegin,primitiveEnd);
            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)6>
                      (state,renderTarget,program,ppVVar10,local_108 - primitiveEnd,
                       (VertexPacketAllocator *)&emitter.m_maxVertices);
          }
          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP) {
            ppVVar10 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&primitiveBegin,primitiveEnd);
            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)4>
                      (state,renderTarget,program,ppVVar10,local_108 - primitiveEnd,
                       (VertexPacketAllocator *)&emitter.m_maxVertices);
          }
          else if (GVar6 == GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP) {
            ppVVar10 = std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::
                       operator[]((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *
                                  )&primitiveBegin,primitiveEnd);
            drawGeometryShaderOutputAsPrimitives<(rr::PrimitiveType)1>
                      (state,renderTarget,program,ppVVar10,local_108 - primitiveEnd,
                       (VertexPacketAllocator *)&emitter.m_maxVertices);
          }
          primitiveEnd = uVar3 + 2;
        }
      }
      std::vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>::~vector
                ((vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *)&primitiveBegin)
      ;
    }
    emitted.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  }
  std::vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_>::~vector
            ((vector<rr::PrimitivePacket,_std::allocator<rr::PrimitivePacket>_> *)&numInvocations);
  GeometryEmitter::~GeometryEmitter((GeometryEmitter *)local_98);
  VertexPacketAllocator::~VertexPacketAllocator((VertexPacketAllocator *)&emitter.m_maxVertices);
  return;
}

Assistant:

void drawWithGeometryShader(const RenderState& state, const RenderTarget& renderTarget, const Program& program, std::vector<typename PrimitiveTypeTraits<DrawPrimitiveType>::Type>& input, DrawContext& drawContext)
{
	// Vertices outputted by geometry shader may have different number of output variables than the original, create new memory allocator
	VertexPacketAllocator vpalloc(program.geometryShader->getOutputs().size());

	// Run geometry shader for all primitives
	GeometryEmitter					emitter			(vpalloc, program.geometryShader->getNumVerticesOut());
	std::vector<PrimitivePacket>	primitives		(input.size());
	const int						numInvocations	= (int)program.geometryShader->getNumInvocations();
	const int						verticesIn		= PrimitiveTypeTraits<DrawPrimitiveType>::Type::NUM_VERTICES;

	for (size_t primitiveNdx = 0; primitiveNdx < input.size(); ++primitiveNdx)
	{
		primitives[primitiveNdx].primitiveIDIn = drawContext.primitiveID++;
		copyVertexPacketPointers(primitives[primitiveNdx].vertices, input[primitiveNdx]);
	}

	if (primitives.empty())
		return;

	for (int invocationNdx = 0; invocationNdx < numInvocations; ++invocationNdx)
	{
		// Shading invocation

		program.geometryShader->shadePrimitives(emitter, verticesIn, &primitives[0], (int)primitives.size(), invocationNdx);

		// Find primitives in the emitted vertices

		std::vector<VertexPacket*> emitted;
		emitter.moveEmittedTo(emitted);

		for (size_t primitiveBegin = 0; primitiveBegin < emitted.size();)
		{
			size_t primitiveEnd;

			// Find primitive begin
			if (!emitted[primitiveBegin])
			{
				++primitiveBegin;
				continue;
			}

			// Find primitive end

			primitiveEnd = primitiveBegin + 1;
			for (; (primitiveEnd < emitted.size()) && emitted[primitiveEnd]; ++primitiveEnd); // find primitive end

			// Draw range [begin, end)

			switch (program.geometryShader->getOutputType())
			{
				case rr::GEOMETRYSHADEROUTPUTTYPE_POINTS:			drawGeometryShaderOutputAsPrimitives<PRIMITIVETYPE_POINTS>			(state, renderTarget, program, &emitted[primitiveBegin], primitiveEnd-primitiveBegin, vpalloc); break;
				case rr::GEOMETRYSHADEROUTPUTTYPE_LINE_STRIP:		drawGeometryShaderOutputAsPrimitives<PRIMITIVETYPE_LINE_STRIP>		(state, renderTarget, program, &emitted[primitiveBegin], primitiveEnd-primitiveBegin, vpalloc); break;
				case rr::GEOMETRYSHADEROUTPUTTYPE_TRIANGLE_STRIP:	drawGeometryShaderOutputAsPrimitives<PRIMITIVETYPE_TRIANGLE_STRIP>	(state, renderTarget, program, &emitted[primitiveBegin], primitiveEnd-primitiveBegin, vpalloc); break;
				default:
					DE_ASSERT(DE_FALSE);
			}

			// Next primitive
			primitiveBegin = primitiveEnd + 1;
		}
	}
}